

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<long_double>::~TPZFileEqnStorage(TPZFileEqnStorage<long_double> *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  remove((this->fFileName)._M_dataplus._M_p);
  pcVar2 = (this->fFileName)._M_dataplus._M_p;
  paVar1 = &(this->fFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TPZManVector<long,_10>::~TPZManVector(&(this->fBlockPos).super_TPZManVector<long,_10>);
  return;
}

Assistant:

TPZFileEqnStorage<TVar>::~TPZFileEqnStorage()
{
	remove(fFileName.c_str());
}